

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmberImproperTorsionType.hpp
# Opt level: O2

void __thiscall
OpenMD::AmberImproperTorsionType::AmberImproperTorsionType
          (AmberImproperTorsionType *this,RealType v2)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_PolynomialInversionType).super_InversionType._vptr_InversionType =
       (_func_int **)&PTR__PolynomialInversionType_002c03a8;
  this->v2_ = v2;
  PolynomialInversionType::setCoefficient(&this->super_PolynomialInversionType,0,v2);
  PolynomialInversionType::setCoefficient(&this->super_PolynomialInversionType,2,-v2);
  return;
}

Assistant:

AmberImproperTorsionType(RealType v2) : PolynomialInversionType(), v2_(v2) {
      // convert AmberImproper Torsion Type to Polynomial Inversion type
      RealType c0 = v2;
      RealType c2 = -v2;

      setCoefficient(0, c0);
      setCoefficient(2, c2);
    }